

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void com_df_set_edge_ver(com_map_t *map,int i_scu,com_ref_pic_t (*refp) [2],int pix_x,int scu_y,
                        int cuh,int edgecondition)

{
  s8 asVar1 [2];
  s8 asVar2 [2];
  s8 (*pasVar3) [2];
  u8 *puVar4;
  s16 (*paasVar5) [2] [2];
  ushort uVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  com_pic_t *pcVar11;
  com_pic_t *pcVar12;
  ushort uVar13;
  com_pic_t *pcVar14;
  int iVar15;
  com_pic_t *pcVar16;
  bool bVar17;
  
  pasVar3 = map->map_refi;
  lVar7 = (long)(scu_y * i_scu + pix_x);
  if ((long)pasVar3[lVar7][0] < 0) {
    pcVar11 = (com_pic_t *)0x0;
  }
  else {
    pcVar11 = refp[pasVar3[lVar7][0]][0].pic;
  }
  if ((long)pasVar3[lVar7][1] < 0) {
    pcVar12 = (com_pic_t *)0x0;
  }
  else {
    pcVar12 = refp[pasVar3[lVar7][1]][1].pic;
  }
  puVar4 = map->map_edge;
  lVar8 = lVar7;
  do {
    bVar17 = cuh == 0;
    cuh = cuh + -1;
    if (bVar17) {
      return;
    }
    if (((byte)map->map_scu[lVar8 + -1] & 0x12) == 0) {
      asVar1 = pasVar3[lVar7];
      asVar2 = map->map_refi[lVar8 + -1];
      if (asVar1 != asVar2) {
        if (asVar2[0] < '\0') {
          pcVar16 = (com_pic_t *)0x0;
        }
        else {
          pcVar16 = *(com_pic_t **)((long)&(*refp)[0].pic + (ulong)(((ushort)asVar2 & 0x7f) << 6));
        }
        if ((short)asVar2 < 0) {
          pcVar14 = (com_pic_t *)0x0;
        }
        else {
          pcVar14 = refp[(ushort)asVar2 >> 8][1].pic;
        }
        if ((pcVar14 == pcVar11) && (pcVar16 == pcVar12)) {
          paasVar5 = map->map_mv;
          if (asVar1[0] < '\0') {
LAB_001129a1:
            if (-1 < (short)asVar1) {
              iVar10 = (int)paasVar5[lVar8][1][0] - (int)paasVar5[lVar8 + -1][0][0];
              iVar15 = -iVar10;
              if (0 < iVar10) {
                iVar15 = iVar10;
              }
              if (3 < (ushort)iVar15) goto LAB_0011284c;
              iVar15 = (int)paasVar5[lVar8][1][1] - (int)paasVar5[lVar8 + -1][0][1];
              uVar6 = (ushort)iVar15;
              uVar13 = -uVar6;
              if (0 < iVar15) {
                uVar13 = uVar6;
              }
              goto joined_r0x001129e8;
            }
            goto LAB_001129ee;
          }
          iVar15 = (int)paasVar5[lVar8][0][0] - (int)paasVar5[lVar8 + -1][1][0];
          uVar6 = (ushort)iVar15;
          uVar13 = -uVar6;
          if (0 < iVar15) {
            uVar13 = uVar6;
          }
          if (uVar13 < 4) {
            iVar15 = (int)paasVar5[lVar8][0][1] - (int)paasVar5[lVar8 + -1][1][1];
            uVar6 = (ushort)iVar15;
            uVar13 = -uVar6;
            if (0 < iVar15) {
              uVar13 = uVar6;
            }
            if (uVar13 < 4) goto LAB_001129a1;
          }
        }
        goto LAB_0011284c;
      }
      paasVar5 = map->map_mv;
      if (-1 < asVar1[0]) {
        iVar15 = (int)paasVar5[lVar8][0][0] - (int)paasVar5[lVar8 + -1][0][0];
        uVar6 = (ushort)iVar15;
        uVar13 = -uVar6;
        if (0 < iVar15) {
          uVar13 = uVar6;
        }
        if (uVar13 < 4) {
          iVar15 = (int)paasVar5[lVar8][0][1] - (int)paasVar5[lVar8 + -1][0][1];
          uVar6 = (ushort)iVar15;
          uVar13 = -uVar6;
          if (0 < iVar15) {
            uVar13 = uVar6;
          }
          if (uVar13 < 4) goto LAB_001128b8;
        }
        goto LAB_0011284c;
      }
LAB_001128b8:
      if (-1 < (short)asVar1) {
        iVar10 = (int)paasVar5[lVar8][1][0] - (int)paasVar5[lVar8 + -1][1][0];
        iVar15 = -iVar10;
        if (0 < iVar10) {
          iVar15 = iVar10;
        }
        if ((ushort)iVar15 < 4) {
          iVar15 = (int)paasVar5[lVar8][1][1] - (int)paasVar5[lVar8 + -1][1][1];
          uVar6 = (ushort)iVar15;
          uVar13 = -uVar6;
          if (0 < iVar15) {
            uVar13 = uVar6;
          }
joined_r0x001129e8:
          if (uVar13 < 4) goto LAB_001129ee;
        }
        goto LAB_0011284c;
      }
LAB_001129ee:
      bVar9 = 0;
    }
    else {
LAB_0011284c:
      bVar9 = 1;
    }
    puVar4[lVar8] = puVar4[lVar8] | bVar9;
    lVar8 = lVar8 + i_scu;
  } while( true );
}

Assistant:

static void uavs3d_always_inline com_df_set_edge_ver_inline(com_map_t *map, int i_scu, com_ref_pic_t refp[MAX_REFS][REFP_NUM], int scu_x, int scu_y, int h, int edgecondition)
{
    int scup = scu_y * i_scu + scu_x;
    u8 *edge_filter = map->map_edge + scup;
    s8 *refi_p = map->map_refi[scup];
    com_pic_t *p_pic0 = REFI_IS_VALID(refi_p[REFP_0]) ? refp[refi_p[REFP_0]][REFP_0].pic : NULL;
    com_pic_t *p_pic1 = REFI_IS_VALID(refi_p[REFP_1]) ? refp[refi_p[REFP_1]][REFP_1].pic : NULL;

    while (h--) {
        *edge_filter |= skip_filter(map, refp, refi_p, p_pic0, p_pic1, scup, -1) ? 0 : edgecondition;
        edge_filter += i_scu;
        scup += i_scu;
    }
}